

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_node_set * __thiscall pugi::xpath_query::evaluate_node_set(xpath_query *this,xpath_node *n)

{
  type_t tVar1;
  undefined8 uVar2;
  xpath_node *in_RDX;
  xpath_query_impl *in_RDI;
  xpath_node_set_raw r;
  xpath_stack_data sd;
  xpath_context c;
  xpath_ast_node *root;
  undefined4 in_stack_ffffffffffffdef0;
  undefined4 in_stack_ffffffffffffdef4;
  xpath_node_set *in_stack_ffffffffffffdf00;
  undefined8 in_stack_ffffffffffffdf08;
  type_t type_;
  xpath_context *this_00;
  xpath_query_impl *this_01;
  xpath_node_set_raw local_20c8 [5];
  nodeset_eval_t in_stack_ffffffffffffdfec;
  xpath_stack *in_stack_ffffffffffffdff0;
  xpath_context *in_stack_ffffffffffffdff8;
  xpath_ast_node *in_stack_ffffffffffffe000;
  byte local_48;
  xpath_context local_40;
  xpath_ast_node *local_20;
  xpath_node *local_18;
  
  type_ = (type_t)((ulong)in_stack_ffffffffffffdf08 >> 0x20);
  this_01 = in_RDI;
  local_18 = in_RDX;
  local_20 = impl::anon_unknown_0::evaluate_node_set_prepare(in_RDI);
  if (local_20 == (xpath_ast_node *)0x0) {
    xpath_node_set::xpath_node_set(in_stack_ffffffffffffdf00);
  }
  else {
    this_00 = &local_40;
    impl::anon_unknown_0::xpath_context::xpath_context(this_00,local_18,1,1);
    impl::anon_unknown_0::xpath_stack_data::xpath_stack_data
              ((xpath_stack_data *)CONCAT44(in_stack_ffffffffffffdef4,in_stack_ffffffffffffdef0));
    impl::anon_unknown_0::xpath_ast_node::eval_node_set
              (in_stack_ffffffffffffe000,in_stack_ffffffffffffdff8,in_stack_ffffffffffffdff0,
               in_stack_ffffffffffffdfec);
    if ((local_48 & 1) != 0) {
      uVar2 = __cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc
                ((bad_alloc *)CONCAT44(in_stack_ffffffffffffdef4,in_stack_ffffffffffffdef0));
      __cxa_throw(uVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    impl::anon_unknown_0::xpath_node_set_raw::begin(local_20c8);
    impl::anon_unknown_0::xpath_node_set_raw::end(local_20c8);
    tVar1 = impl::anon_unknown_0::xpath_node_set_raw::type(local_20c8);
    xpath_node_set::xpath_node_set
              ((xpath_node_set *)this_01,(const_iterator)in_RDI,&this_00->n,type_);
    impl::anon_unknown_0::xpath_stack_data::~xpath_stack_data
              ((xpath_stack_data *)CONCAT44(tVar1,in_stack_ffffffffffffdef0));
  }
  return (xpath_node_set *)this_01;
}

Assistant:

PUGI_IMPL_FN xpath_node_set xpath_query::evaluate_node_set(const xpath_node& n) const
	{
		impl::xpath_ast_node* root = impl::evaluate_node_set_prepare(static_cast<impl::xpath_query_impl*>(_impl));
		if (!root) return xpath_node_set();

		impl::xpath_context c(n, 1, 1);
		impl::xpath_stack_data sd;

		impl::xpath_node_set_raw r = root->eval_node_set(c, sd.stack, impl::nodeset_eval_all);

		if (sd.oom)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return xpath_node_set();
		#else
			throw std::bad_alloc();
		#endif
		}

		return xpath_node_set(r.begin(), r.end(), r.type());
	}